

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O3

void __thiscall
WSNTopologyBasedEnergy::WSNTopologyBasedEnergy(WSNTopologyBasedEnergy *this,TransportType type)

{
  WSNNode *this_00;
  undefined1 auVar1 [16];
  long lVar2;
  WSNNode *pWVar3;
  undefined1 auVar4 [16];
  WSNNode local_b8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar5;
  
  cv::Mat::Mat(&this->img);
  this_00 = &this->sink;
  WSNNode::WSNNode(this_00);
  pWVar3 = this->node;
  lVar2 = 0;
  do {
    WSNNode::WSNNode(pWVar3);
    lVar2 = lVar2 + -0x38;
    pWVar3 = pWVar3 + 1;
  } while (lVar2 != -0x15e0);
  pWVar3 = this->LayerFirstLinkNode;
  lVar2 = 0;
  do {
    WSNNode::WSNNode(pWVar3);
    lVar2 = lVar2 + -0x38;
    pWVar3 = pWVar3 + 1;
  } while (lVar2 != -0x118);
  lVar2 = 0;
  memset(this->layer,0,0xf0);
  pWVar3 = this->LayerLeaderNode;
  do {
    WSNNode::WSNNode(pWVar3);
    lVar2 = lVar2 + -0x38;
    pWVar3 = pWVar3 + 1;
  } while (lVar2 != -0x118);
  this->type_ = (char)type;
  local_58 = 0x406fe00000000000;
  uStack_50 = 0x406fe00000000000;
  local_48 = 0x406fe00000000000;
  uStack_40 = 0;
  cv::Mat::Mat((Mat *)&local_b8,600,600,0x10,(Scalar_ *)&local_58);
  cv::Mat::operator=(&this->img,(Mat *)&local_b8);
  cv::Mat::~Mat((Mat *)&local_b8);
  this->Test = true;
  lVar2 = 0;
  WSNNode::WSNNode(&local_b8,0,0);
  (this->sink).leaderID = local_b8.leaderID;
  (this->sink).id = local_b8.id;
  this_00->x = local_b8.x;
  this_00->y = local_b8.y;
  (this->sink).energy = local_b8.energy;
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
  WSNNode::~WSNNode(&local_b8);
  this->alpha = 1.4e-05;
  this->TopLayer = 0;
  this->ENERGY = 100.0;
  this->NetThresEnergy = 75.0;
  this->Mark[0] = 0;
  this->Mark[1] = 0;
  this->Mark[2] = 0;
  this->Mark[3] = 0;
  this->Mark[4] = 0;
  auVar1 = _DAT_0010c430;
  auVar4 = _DAT_0010c420;
  do {
    if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7ffffffb) {
      this->ThresEnergy[lVar2] = 75.0;
      this->ThresEnergy[lVar2 + 1] = 75.0;
    }
    lVar2 = lVar2 + 2;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
  } while (lVar2 != 6);
  return;
}

Assistant:

WSNTopologyBasedEnergy::WSNTopologyBasedEnergy(TransportType type){
	type_ = type;
	img = Mat(600,600,CV_8UC3,Scalar(255,255,255));
	//是否测试
	Test= true;
	//汇聚节点
	sink=WSNNode(0,0);
	//能量传送系数
	alpha = 0.000014;
	//直接与sink节点通信的层号
	TopLayer=0;
	//节点能量初始值
	ENERGY=100;
	//整个网络的能力阈值
	NetThresEnergy=75;
	for(int i=0;i<LayerNum;i++){
		//标记
		Mark[i]=0;
		//每层的能量阈值
		ThresEnergy[i]=75;
	}
}